

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t FSE_buildDTable(FSE_DTable *dt,short *normalizedCounter,uint maxSymbolValue,uint tableLog)

{
  short sVar1;
  size_t sVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  ushort uVar8;
  long lVar9;
  uint uVar10;
  undefined2 uVar11;
  int iVar12;
  ulong uVar13;
  U16 symbolNext [256];
  ushort local_228 [256];
  
  bVar3 = (byte)tableLog;
  uVar10 = 1 << (bVar3 & 0x1f);
  sVar2 = 0xffffffffffffffd2;
  if ((maxSymbolValue < 0x100) && (sVar2 = 0xffffffffffffffd4, tableLog < 0xd)) {
    uVar6 = maxSymbolValue + 1;
    uVar11 = 1;
    uVar13 = 0;
    uVar5 = (ulong)(uVar10 - 1);
    do {
      uVar8 = normalizedCounter[uVar13];
      if ((short)uVar8 == -1) {
        *(char *)((long)dt + uVar5 * 4 + 6) = (char)uVar13;
        uVar8 = 1;
        uVar5 = (ulong)((int)uVar5 - 1);
      }
      else if ((0x10000 << (bVar3 - 1 & 0x1f)) >> 0x10 <= (int)(short)uVar8) {
        uVar11 = 0;
      }
      local_228[uVar13] = uVar8;
      uVar13 = uVar13 + 1;
    } while (uVar6 != uVar13);
    *(short *)dt = (short)tableLog;
    *(undefined2 *)((long)dt + 2) = uVar11;
    uVar13 = 0;
    uVar7 = 0;
    do {
      sVar1 = normalizedCounter[uVar13];
      if (0 < sVar1) {
        iVar12 = 0;
        do {
          *(char *)((long)dt + (ulong)uVar7 * 4 + 6) = (char)uVar13;
          do {
            uVar7 = uVar7 + (uVar10 >> 3) + (uVar10 >> 1) + 3 & uVar10 - 1;
          } while ((uint)uVar5 < uVar7);
          iVar12 = iVar12 + 1;
        } while (iVar12 != sVar1);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar6 + (uVar6 == 0));
    sVar2 = 0xffffffffffffffff;
    if (uVar7 == 0) {
      sVar2 = 0;
      lVar9 = 0;
      do {
        bVar4 = *(byte *)((long)dt + lVar9 * 4 + 6);
        uVar8 = local_228[bVar4];
        local_228[bVar4] = uVar8 + 1;
        if (uVar8 == 0) {
          __assert_fail("val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x5a1,"unsigned int BIT_highbit32(U32)");
        }
        iVar12 = 0x1f;
        if (uVar8 != 0) {
          for (; uVar8 >> iVar12 == 0; iVar12 = iVar12 + -1) {
          }
        }
        bVar4 = bVar3 - (char)iVar12;
        *(byte *)((long)dt + lVar9 * 4 + 7) = bVar4;
        *(ushort *)(dt + lVar9 + 1) = (uVar8 << (bVar4 & 0x1f)) - (short)uVar10;
        lVar9 = lVar9 + 1;
      } while (uVar10 != (uint)lVar9);
    }
  }
  return sVar2;
}

Assistant:

size_t FSE_buildDTable(FSE_DTable* dt, const short* normalizedCounter, unsigned maxSymbolValue, unsigned tableLog)
{
    void* const tdPtr = dt+1;   /* because *dt is unsigned, 32-bits aligned on 32-bits */
    FSE_DECODE_TYPE* const tableDecode = (FSE_DECODE_TYPE*) (tdPtr);
    U16 symbolNext[FSE_MAX_SYMBOL_VALUE+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    if (maxSymbolValue > FSE_MAX_SYMBOL_VALUE) return ERROR(maxSymbolValue_tooLarge);
    if (tableLog > FSE_MAX_TABLELOG) return ERROR(tableLog_tooLarge);

    /* Init, lay down lowprob symbols */
    {   FSE_DTableHeader DTableH;
        DTableH.tableLog = (U16)tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].symbol = (FSE_FUNCTION_TYPE)s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    symbolNext[s] = normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].symbol = (FSE_FUNCTION_TYPE)s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        if (position!=0) return ERROR(GENERIC);   /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            FSE_FUNCTION_TYPE const symbol = (FSE_FUNCTION_TYPE)(tableDecode[u].symbol);
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].newState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
    }   }

    return 0;
}